

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O0

void av1_calculate_tile_rows(SequenceHeader *seq_params,int cm_mi_rows,CommonTileParams *tiles)

{
  int iVar1;
  int iVar2;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int i;
  int size_sb;
  int start_sb;
  int sb_rows;
  int local_2c;
  int local_28;
  int local_20;
  
  iVar1 = in_ESI + (1 << ((byte)*(undefined4 *)(in_RDI + 0x24) & 0x1f)) + -1 >>
          ((byte)*(undefined4 *)(in_RDI + 0x24) & 0x1f);
  if (*(int *)(in_RDX + 0x14) == 0) {
    iVar1 = tile_log2(1,*(int *)(in_RDX + 4));
    *(int *)(in_RDX + 0x1c) = iVar1;
  }
  else {
    iVar2 = iVar1 + (1 << ((byte)*(undefined4 *)(in_RDX + 0x1c) & 0x1f)) + -1 >>
            ((byte)*(undefined4 *)(in_RDX + 0x1c) & 0x1f);
    local_28 = 0;
    for (local_20 = 0; local_20 < iVar1; local_20 = iVar2 + local_20) {
      *(int *)(in_RDX + 0x140 + (long)local_28 * 4) = local_20;
      local_28 = local_28 + 1;
    }
    *(int *)(in_RDX + 4) = local_28;
    *(int *)(in_RDX + 0x140 + (long)local_28 * 4) = iVar1;
    *(int *)(in_RDX + 0x24) = iVar2 << ((byte)*(undefined4 *)(in_RDI + 0x24) & 0x1f);
    local_2c = in_ESI;
    if (*(int *)(in_RDX + 0x24) < in_ESI) {
      local_2c = *(int *)(in_RDX + 0x24);
    }
    *(int *)(in_RDX + 0x24) = local_2c;
  }
  return;
}

Assistant:

void av1_calculate_tile_rows(const SequenceHeader *const seq_params,
                             int cm_mi_rows, CommonTileParams *const tiles) {
  int sb_rows = CEIL_POWER_OF_TWO(cm_mi_rows, seq_params->mib_size_log2);
  int start_sb, size_sb, i;

  if (tiles->uniform_spacing) {
    size_sb = CEIL_POWER_OF_TWO(sb_rows, tiles->log2_rows);
    assert(size_sb > 0);
    for (i = 0, start_sb = 0; start_sb < sb_rows; i++) {
      tiles->row_start_sb[i] = start_sb;
      start_sb += size_sb;
    }
    tiles->rows = i;
    tiles->row_start_sb[i] = sb_rows;

    tiles->height = size_sb << seq_params->mib_size_log2;
    tiles->height = AOMMIN(tiles->height, cm_mi_rows);
  } else {
    tiles->log2_rows = tile_log2(1, tiles->rows);
  }
}